

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void M_Ticker(void)

{
  int iVar1;
  float fVar2;
  int i;
  ulong uVar3;
  long lVar4;
  
  DMenu::MenuTime = DMenu::MenuTime + 1;
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[9])();
    lVar4 = 0;
    uVar3 = 0;
    do {
      if ((((char)MenuButtons[0].Keys[lVar4 * 2 + 6] != '\0') &&
          (iVar1 = *(int *)((long)MenuButtonTickers + lVar4), 0 < iVar1)) &&
         (*(int *)((long)MenuButtonTickers + lVar4) = iVar1 + -1, iVar1 == 1)) {
        *(undefined4 *)((long)MenuButtonTickers + lVar4) = 3;
        (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[8])
                  (DMenu::CurrentMenu,uVar3 & 0xffffffff,(ulong)MenuButtonOrigin[uVar3]);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 4;
    } while (uVar3 != 9);
    if (BackbuttonTime < 1) {
      fVar2 = (float)(~-(uint)(0.0 < BackbuttonAlpha) & (uint)BackbuttonAlpha |
                     (uint)(BackbuttonAlpha + -0.1) & -(uint)(0.0 < BackbuttonAlpha));
      if (((0.0 < BackbuttonAlpha) || (fVar2 < 0.0)) && (BackbuttonAlpha = fVar2, fVar2 <= 0.0)) {
        BackbuttonAlpha = 0.0;
      }
    }
    else {
      fVar2 = (float)(~-(uint)(BackbuttonAlpha < 1.0) & (uint)BackbuttonAlpha |
                     (uint)(BackbuttonAlpha + 0.1) & -(uint)(BackbuttonAlpha < 1.0));
      if (((BackbuttonAlpha < 1.0) || (1.0 < fVar2)) && (BackbuttonAlpha = fVar2, 1.0 <= fVar2)) {
        BackbuttonAlpha = 1.0;
      }
      BackbuttonTime = BackbuttonTime + -1;
    }
  }
  return;
}

Assistant:

void M_Ticker (void) 
{
	DMenu::MenuTime++;
	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		DMenu::CurrentMenu->Ticker();

		for (int i = 0; i < NUM_MKEYS; ++i)
		{
			if (MenuButtons[i].bDown)
			{
				if (MenuButtonTickers[i] > 0 &&	--MenuButtonTickers[i] <= 0)
				{
					MenuButtonTickers[i] = KEY_REPEAT_RATE;
					DMenu::CurrentMenu->MenuEvent(i, MenuButtonOrigin[i]);
				}
			}
		}
		if (BackbuttonTime > 0)
		{
			if (BackbuttonAlpha < 1.f) BackbuttonAlpha += .1f;
			if (BackbuttonAlpha > 1.f) BackbuttonAlpha = 1.f;
			BackbuttonTime--;
		}
		else
		{
			if (BackbuttonAlpha > 0) BackbuttonAlpha -= .1f;
			if (BackbuttonAlpha < 0) BackbuttonAlpha = 0;
		}
	}
}